

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O0

ByteCode * __thiscall ag::Generator::Get(ByteCode *__return_storage_ptr__,Generator *this)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  Type TVar4;
  size_type sVar5;
  reference pvVar6;
  vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *__x;
  reference pvVar7;
  char *pcVar8;
  reference pvVar9;
  char *pcVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  size_t sVar14;
  reference obj;
  int __c;
  ByteCode local_438;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_420;
  ulong local_408;
  size_t j_2;
  size_t i_7;
  size_t curMethod;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3d8;
  ulong local_3c0;
  size_t i_6;
  size_t curFunc;
  size_t local_398;
  string local_390;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_370;
  ulong local_358;
  size_t j_1;
  string local_338;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_318;
  ulong local_300;
  size_t j;
  string local_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2c0;
  ulong local_2a8;
  size_t i_5;
  undefined1 local_288 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> methodStartAddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_248;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  char *local_208;
  size_t i_4;
  char *pcStack_1f8;
  bool written;
  size_t t;
  size_t local_1d8;
  string local_1d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b0;
  ulong local_198;
  size_t i_3;
  ulong local_178;
  size_t i_2;
  undefined1 local_168 [6];
  uint16_t funcCount;
  vector<unsigned_long,_std::allocator<unsigned_long>_> funcStartAddr;
  vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> funcs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  ulong local_100;
  size_t i_1;
  string local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  ulong local_a8;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  allocator<char> local_59;
  string local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  byte local_19;
  Generator *local_18;
  Generator *this_local;
  ByteCode *bret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Generator *)__return_storage_ptr__;
  ByteCode::ByteCode(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"BVM",&local_59);
  BitConverter::GetString(&local_38,&local_58,false);
  ByteCode::Add(__return_storage_ptr__,&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  ByteCode::Add(__return_storage_ptr__,this->m_ver_major);
  BitConverter::GetUInt16(&local_88,this->m_ver_minor);
  ByteCode::Add(__return_storage_ptr__,&local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_strtbl);
  BitConverter::GetUInt32((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(uint)sVar5);
  ByteCode::Add(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  for (local_a8 = 0; uVar2 = local_a8,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_strtbl), uVar2 < sVar5; local_a8 = local_a8 + 1) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_strtbl,local_a8);
    std::__cxx11::string::string((string *)&local_e0,(string *)pvVar6);
    BitConverter::GetString(&local_c0,&local_e0,true);
    ByteCode::Add(__return_storage_ptr__,&local_c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_globals);
  BitConverter::GetUInt16
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,(uint16_t)sVar5);
  ByteCode::Add(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1
               );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
  for (local_100 = 0; uVar2 = local_100,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_globals), uVar2 < sVar5; local_100 = local_100 + 1) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_globals,local_100);
    std::__cxx11::string::string
              ((string *)
               &funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar6);
    BitConverter::GetString
              (&local_118,
               (string *)
               &funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,true);
    ByteCode::Add(__return_storage_ptr__,&local_118);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_118);
    std::__cxx11::string::~string
              ((string *)
               &funcs.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  __x = FunctionManager::GetData(&this->Function);
  std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::vector
            ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
             &funcStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
  i_2._6_2_ = 0;
  for (local_178 = 0; uVar2 = local_178,
      sVar5 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::size
                        ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
                         &funcStartAddr.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), uVar2 < sVar5;
      local_178 = local_178 + 1) {
    pvVar7 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::operator[]
                       ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
                        &funcStartAddr.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,local_178);
    bVar3 = std::operator!=(&pvVar7->Object,"");
    if (!bVar3) {
      i_2._6_2_ = i_2._6_2_ + 1;
    }
  }
  BitConverter::GetUInt16((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_3,i_2._6_2_);
  ByteCode::Add(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_3
               );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_3);
  for (local_198 = 0; uVar2 = local_198,
      sVar5 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::size
                        ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
                         &funcStartAddr.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), uVar2 < sVar5;
      local_198 = local_198 + 1) {
    pvVar7 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::operator[]
                       ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
                        &funcStartAddr.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,local_198);
    bVar3 = std::operator!=(&pvVar7->Object,"");
    if (!bVar3) {
      pvVar7 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::operator[]
                         ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
                          &funcStartAddr.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,local_198);
      std::__cxx11::string::string((string *)&local_1d0,(string *)&pvVar7->Name);
      BitConverter::GetString(&local_1b0,&local_1d0,true);
      ByteCode::Add(__return_storage_ptr__,&local_1b0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      local_1d8 = ByteCode::Count(__return_storage_ptr__);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,&local_1d8);
      BitConverter::GetUInt32((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&t,0);
      ByteCode::Add(__return_storage_ptr__,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&t);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&t);
    }
  }
  sVar5 = std::
          vector<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&this->m_consts);
  ByteCode::Add(__return_storage_ptr__,(uint8_t)sVar5);
  for (pcStack_1f8 = (char *)0x0; pcStack_1f8 < (char *)0x5; pcStack_1f8 = pcStack_1f8 + 1) {
    i_4._7_1_ = 0;
    for (local_208 = (char *)0x0; pcVar10 = local_208,
        pcVar8 = (char *)std::
                         vector<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::size(&this->m_consts), pcVar10 < pcVar8; local_208 = local_208 + 1) {
      pcVar10 = local_208;
      pvVar9 = std::
               vector<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->m_consts,(size_type)local_208);
      pcVar10 = std::
                variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::index(pvVar9,pcVar10,__c);
      if (pcVar10 == pcStack_1f8) {
        if ((i_4._7_1_ & 1) == 0) {
          pvVar9 = std::
                   vector<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->m_consts,(size_type)local_208);
          std::
          variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::variant(&local_230,pvVar9);
          TVar4 = VariantToType(&local_230);
          ByteCode::Add(__return_storage_ptr__,(uint8_t)TVar4);
          std::
          variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant(&local_230);
          i_4._7_1_ = 1;
        }
        pvVar9 = std::
                 vector<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->m_consts,(size_type)local_208);
        std::
        variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&methodStartAddr.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pvVar9);
        BitConverter::Get(&local_248,
                          (agvariant *)
                          &methodStartAddr.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
        ByteCode::Add(__return_storage_ptr__,&local_248);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_248);
        std::
        variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&methodStartAddr.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_objNames);
  BitConverter::GetUInt16
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_5,(uint16_t)sVar5);
  ByteCode::Add(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_5
               );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_5);
  for (local_2a8 = 0; uVar2 = local_2a8,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_objNames), uVar2 < sVar5; local_2a8 = local_2a8 + 1) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_objNames,local_2a8);
    std::__cxx11::string::string((string *)&local_2e0,(string *)pvVar6);
    BitConverter::GetString(&local_2c0,&local_2e0,true);
    ByteCode::Add(__return_storage_ptr__,&local_2c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    pvVar11 = std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->m_objProps,local_2a8);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar11);
    BitConverter::GetUInt16
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,(uint16_t)sVar5);
    ByteCode::Add(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j
                 );
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j);
    local_300 = 0;
    while( true ) {
      uVar2 = local_300;
      pvVar11 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&this->m_objProps,local_2a8);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar11);
      if (sVar5 <= uVar2) break;
      pvVar11 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&this->m_objProps,local_2a8);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar11,local_300);
      std::__cxx11::string::string((string *)&local_338,(string *)pvVar6);
      BitConverter::GetString(&local_318,&local_338,true);
      ByteCode::Add(__return_storage_ptr__,&local_318);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      local_300 = local_300 + 1;
    }
    pvVar12 = std::
              vector<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
              ::operator[](&this->m_objMethods,local_2a8);
    sVar5 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::size(pvVar12);
    BitConverter::GetUInt16
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j_1,(uint16_t)sVar5);
    ByteCode::Add(__return_storage_ptr__,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j_1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j_1);
    local_358 = 0;
    while( true ) {
      uVar2 = local_358;
      pvVar12 = std::
                vector<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ::operator[](&this->m_objMethods,local_2a8);
      sVar5 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::size(pvVar12);
      if (sVar5 <= uVar2) break;
      pvVar12 = std::
                vector<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ::operator[](&this->m_objMethods,local_2a8);
      pvVar7 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::operator[]
                         (pvVar12,local_358);
      std::__cxx11::string::string((string *)&local_390,(string *)&pvVar7->Name);
      BitConverter::GetString(&local_370,&local_390,true);
      ByteCode::Add(__return_storage_ptr__,&local_370);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      local_398 = ByteCode::Count(__return_storage_ptr__);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288,&local_398);
      BitConverter::GetUInt32((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&curFunc,0);
      ByteCode::Add(__return_storage_ptr__,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&curFunc);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&curFunc);
      local_358 = local_358 + 1;
    }
  }
  i_6 = 0;
  for (local_3c0 = 0; uVar2 = local_3c0,
      sVar5 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::size
                        ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
                         &funcStartAddr.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), uVar2 < sVar5;
      local_3c0 = local_3c0 + 1) {
    pvVar7 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::operator[]
                       ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
                        &funcStartAddr.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,local_3c0);
    bVar3 = std::operator!=(&pvVar7->Object,"");
    if (!bVar3) {
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,i_6);
      sVar1 = *pvVar13;
      sVar14 = ByteCode::Count(__return_storage_ptr__);
      BitConverter::GetUInt32(&local_3d8,(uint)sVar14);
      ByteCode::Write(__return_storage_ptr__,sVar1,&local_3d8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3d8);
      FunctionManager::Get((ByteCode *)&curMethod,&this->Function,local_3c0);
      ByteCode::Add(__return_storage_ptr__,(ByteCode *)&curMethod);
      ByteCode::~ByteCode((ByteCode *)&curMethod);
      i_6 = i_6 + 1;
    }
  }
  i_7 = 0;
  for (j_2 = 0; sVar1 = j_2,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_objNames), sVar1 < sVar5; j_2 = j_2 + 1) {
    local_408 = 0;
    while( true ) {
      uVar2 = local_408;
      pvVar12 = std::
                vector<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ::operator[](&this->m_objMethods,j_2);
      sVar5 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::size(pvVar12);
      if (sVar5 <= uVar2) break;
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288,i_7);
      sVar1 = *pvVar13;
      sVar14 = ByteCode::Count(__return_storage_ptr__);
      BitConverter::GetUInt32(&local_420,(uint)sVar14);
      ByteCode::Write(__return_storage_ptr__,sVar1,&local_420);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_420);
      pvVar12 = std::
                vector<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ::operator[](&this->m_objMethods,j_2);
      pvVar7 = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::operator[]
                         (pvVar12,local_408);
      pvVar12 = std::
                vector<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ::operator[](&this->m_objMethods,j_2);
      obj = std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::operator[]
                      (pvVar12,local_408);
      FunctionManager::Get(&local_438,&this->Function,&pvVar7->Name,&obj->Object);
      ByteCode::Add(__return_storage_ptr__,&local_438);
      ByteCode::~ByteCode(&local_438);
      i_7 = i_7 + 1;
      local_408 = local_408 + 1;
    }
  }
  local_19 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_288);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
  std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::~vector
            ((vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> *)
             &funcStartAddr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((local_19 & 1) == 0) {
    ByteCode::~ByteCode(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ByteCode Get()
		{
			ByteCode bret;


			// header
			bret.Add(BitConverter::GetString(std::string("BVM"), false));


			// version
			bret.Add(m_ver_major);
			bret.Add(BitConverter::GetUInt16(m_ver_minor));


			// string table
			bret.Add(BitConverter::GetUInt32(m_strtbl.size()));
			for (size_t i = 0; i < m_strtbl.size(); i++)
				bret.Add(BitConverter::GetString(m_strtbl[i]));

			// globals
			bret.Add(BitConverter::GetUInt16(m_globals.size()));
			for (size_t i = 0; i < m_globals.size(); i++)
				bret.Add(BitConverter::GetString(m_globals[i]));	// name


															// function names
			std::vector<FunctionData> funcs = Function.GetData();
			std::vector<size_t> funcStartAddr;

			uint16_t funcCount = 0;
			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;
				funcCount++;
			}
			bret.Add(BitConverter::GetUInt16(funcCount));

			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;

				bret.Add(BitConverter::GetString(funcs[i].Name));
				funcStartAddr.push_back(bret.Count());
				bret.Add(BitConverter::GetUInt32(0u));
			}


			// constants
			bret.Add(m_consts.size());
			for (size_t t = 0; t < variant_type_count; t++) {
				bool written = false;
				for (size_t i = 0; i < m_consts.size(); i++) {
					if (m_consts[i].index() == t) {
						if (!written) {
							bret.Add((uint8_t)VariantToType(m_consts[i]));
							written = true;
						}
						bret.Add(BitConverter::Get(m_consts[i]));
					}
				}
			}


			// objects
			std::vector<size_t> methodStartAddr;
			bret.Add(BitConverter::GetUInt16(m_objNames.size()));
			for (size_t i = 0; i < m_objNames.size(); i++) {
				bret.Add(BitConverter::GetString(m_objNames[i]));

				bret.Add(BitConverter::GetUInt16(m_objProps[i].size()));
				for (size_t j = 0; j < m_objProps[i].size(); j++)
					bret.Add(BitConverter::GetString(m_objProps[i][j]));

				bret.Add(BitConverter::GetUInt16(m_objMethods[i].size()));
				for (size_t j = 0; j < m_objMethods[i].size(); j++) {
					bret.Add(BitConverter::GetString(m_objMethods[i][j].Name));
					methodStartAddr.push_back(bret.Count());
					bret.Add(BitConverter::GetUInt32(0u));
				}
			}


			// function code
			size_t curFunc = 0;
			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;

				bret.Write(funcStartAddr[curFunc], BitConverter::GetUInt32(bret.Count()));
				bret.Add(Function.Get(i));
				curFunc++;
			}

			// method code
			size_t curMethod = 0;
			for (size_t i = 0; i < m_objNames.size(); i++) {
				for (size_t j = 0; j < m_objMethods[i].size(); j++) {
					bret.Write(methodStartAddr[curMethod], BitConverter::GetUInt32(bret.Count()));
					bret.Add(Function.Get(m_objMethods[i][j].Name, m_objMethods[i][j].Object));
					// TODO: method overloading
					curMethod++;
				}
			}

			return bret;
		}